

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  long lVar1;
  fmt_helper *this_00;
  char *pcVar2;
  memory_buf_t *pmVar3;
  size_t sVar4;
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  char local_39;
  long local_38;
  
  lVar1 = (msg->time).__d.__r / 1000000000;
  sVar4 = (this->cached_datetime_).super_buffer<char>.size_;
  if (sVar4 == 0 || (this->cache_timestamp_).__r != lVar1) {
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    pmVar3 = &this->cached_datetime_;
    local_39 = '[';
    local_38 = lVar1;
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,pmVar3);
    local_39 = '-';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_mon + 1,pmVar3);
    local_39 = '-';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_mday,pmVar3);
    local_39 = ' ';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_hour,pmVar3);
    local_39 = ':';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_min,pmVar3);
    local_39 = ':';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_sec,pmVar3);
    local_39 = '.';
    ::fmt::v6::internal::buffer<char>::push_back(&pmVar3->super_buffer<char>,&local_39);
    (this->cache_timestamp_).__r = local_38;
    sVar4 = (this->cached_datetime_).super_buffer<char>.size_;
  }
  pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
  ::fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  pmVar3 = (memory_buf_t *)(msg->time).__d.__r;
  fmt_helper::pad3<unsigned_int>
            ((int)((long)pmVar3 / 1000000000) * -1000 + (int)((long)pmVar3 / 1000000),dest);
  local_39 = ']';
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  local_39 = ' ';
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  if ((msg->logger_name).size_ != 0) {
    local_39 = '[';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    view.size_ = (size_t)dest;
    view.data_ = (char *)(msg->logger_name).size_;
    fmt_helper::append_string_view((fmt_helper *)(msg->logger_name).data_,view,pmVar3);
    local_39 = ']';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    local_39 = ' ';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  }
  local_39 = '[';
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  msg->color_range_start = (dest->super_buffer<char>).size_;
  pmVar3 = (memory_buf_t *)&level::level_string_views;
  view_00.size_ = (size_t)dest;
  view_00.data_ = (char *)(&DAT_001d4758)[(ulong)msg->level * 2];
  fmt_helper::append_string_view
            ((fmt_helper *)(&level::level_string_views)[(ulong)msg->level * 2],view_00,
             (memory_buf_t *)&level::level_string_views);
  msg->color_range_end = (dest->super_buffer<char>).size_;
  local_39 = ']';
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  local_39 = ' ';
  ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  if ((msg->source).line != 0) {
    local_39 = '[';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    this_00 = (fmt_helper *)
              short_filename_formatter<spdlog::details::null_scoped_padder>::basename
                        ((msg->source).filename);
    pcVar2 = (char *)strlen((char *)this_00);
    view_01.size_ = (size_t)dest;
    view_01.data_ = pcVar2;
    fmt_helper::append_string_view(this_00,view_01,pmVar3);
    local_39 = ':';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    fmt_helper::append_int<int>((msg->source).line,dest);
    local_39 = ']';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    local_39 = ' ';
    ::fmt::v6::internal::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  }
  view_02.size_ = (size_t)dest;
  view_02.data_ = (char *)(msg->payload).size_;
  fmt_helper::append_string_view((fmt_helper *)(msg->payload).data_,view_02,pmVar3);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

#ifndef SPDLOG_NO_NAME
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            // fmt_helper::append_str(*msg.logger_name, dest);
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
#endif
        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }